

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

void av1_resize_and_extend_frame_c
               (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,InterpFilter filter,int phase_scaler
               ,int num_planes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  InterpKernel *filter_00;
  uint8_t *puVar6;
  long lVar7;
  long lVar8;
  uint y0_q4;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  undefined7 in_register_00000011;
  int iVar15;
  int iVar16;
  uint x0_q4;
  long lVar17;
  long lVar18;
  int iVar19;
  uint8_t *local_80;
  
  filter_00 = *(InterpKernel **)
               ((long)&av1_interp_filter_params_list[0].filter_ptr +
               (ulong)(uint)((int)CONCAT71(in_register_00000011,filter) << 4));
  uVar9 = 3;
  if (num_planes < 3) {
    uVar9 = (ulong)(uint)num_planes;
  }
  uVar14 = 0;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  for (; uVar14 != uVar9; uVar14 = uVar14 + 1) {
    lVar10 = (ulong)(uVar14 != 0) * 4;
    iVar1 = *(int *)((long)src->store_buf_adr + lVar10 + -0x38);
    iVar2 = *(int *)((long)src->store_buf_adr + lVar10 + -0x30);
    puVar6 = src->store_buf_adr[uVar14 - 4];
    iVar3 = *(int *)((long)src->store_buf_adr + lVar10 + -0x28);
    iVar4 = *(int *)((long)dst->store_buf_adr + lVar10 + -0x38);
    iVar5 = *(int *)((long)dst->store_buf_adr + lVar10 + -0x30);
    local_80 = dst->store_buf_adr[uVar14 - 4];
    lVar10 = (long)*(int *)((long)dst->store_buf_adr + lVar10 + -0x28);
    iVar12 = iVar2 * 0x10;
    iVar16 = iVar1 * 0x10;
    for (lVar13 = 0; lVar11 = iVar5 - lVar13, lVar11 != 0 && lVar13 <= iVar5; lVar13 = lVar13 + 0x10
        ) {
      iVar15 = 0;
      y0_q4 = 0;
      if (iVar2 != iVar5) {
        y0_q4 = (iVar12 * (int)lVar13) / iVar5 + phase_scaler & 0xf;
      }
      lVar7 = 0x10;
      if ((int)lVar11 < 0x10) {
        lVar7 = lVar11;
      }
      iVar19 = 0;
      lVar17 = (long)iVar4;
      for (lVar18 = 0; lVar18 < iVar4; lVar18 = lVar18 + 0x10) {
        x0_q4 = 0;
        if (iVar1 != iVar4) {
          x0_q4 = iVar15 / iVar4 + phase_scaler & 0xf;
        }
        if ((lVar17 < 0x10) || (lVar11 < 0x10)) {
          lVar8 = 0x10;
          if ((int)lVar17 < 0x10) {
            lVar8 = lVar17;
          }
          aom_scaled_2d_c(puVar6 + (long)(((iVar2 * (int)lVar13) / iVar5) * iVar3) +
                                   (long)(iVar19 / iVar4),(long)iVar3,local_80 + lVar18,lVar10,
                          filter_00,x0_q4,iVar16 / iVar4,y0_q4,iVar12 / iVar5,(int)lVar8,(int)lVar7)
          ;
        }
        else {
          (*aom_scaled_2d)(puVar6 + (long)(((iVar2 * (int)lVar13) / iVar5) * iVar3) +
                                    (long)(iVar19 / iVar4),(long)iVar3,local_80 + lVar18,lVar10,
                           filter_00,x0_q4,iVar16 / iVar4,y0_q4,iVar12 / iVar5,0x10,0x10);
        }
        iVar19 = iVar19 + iVar16;
        iVar15 = iVar15 + iVar1 * 0x100;
        lVar17 = lVar17 + -0x10;
      }
      local_80 = local_80 + lVar10 * 0x10;
    }
  }
  aom_extend_frame_borders_c(dst,num_planes);
  return;
}

Assistant:

void av1_resize_and_extend_frame_c(const YV12_BUFFER_CONFIG *src,
                                   YV12_BUFFER_CONFIG *dst,
                                   const InterpFilter filter,
                                   const int phase_scaler,
                                   const int num_planes) {
  assert(filter == BILINEAR || filter == EIGHTTAP_SMOOTH ||
         filter == EIGHTTAP_REGULAR);
  const InterpKernel *const kernel =
      (const InterpKernel *)av1_interp_filter_params_list[filter].filter_ptr;

  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
    const int src_w = src->crop_widths[is_uv];
    const int src_h = src->crop_heights[is_uv];
    const uint8_t *src_buffer = src->buffers[i];
    const int src_stride = src->strides[is_uv];
    const int dst_w = dst->crop_widths[is_uv];
    const int dst_h = dst->crop_heights[is_uv];
    uint8_t *dst_buffer = dst->buffers[i];
    const int dst_stride = dst->strides[is_uv];
    for (int y = 0; y < dst_h; y += 16) {
      const int y_q4 =
          src_h == dst_h ? 0 : y * 16 * src_h / dst_h + phase_scaler;
      for (int x = 0; x < dst_w; x += 16) {
        const int x_q4 =
            src_w == dst_w ? 0 : x * 16 * src_w / dst_w + phase_scaler;
        const uint8_t *src_ptr =
            src_buffer + y * src_h / dst_h * src_stride + x * src_w / dst_w;
        uint8_t *dst_ptr = dst_buffer + y * dst_stride + x;

        // Width and height of the actual working area.
        const int work_w = AOMMIN(16, dst_w - x);
        const int work_h = AOMMIN(16, dst_h - y);
        // SIMD versions of aom_scaled_2d() have some trouble handling
        // nonstandard sizes, so fall back on the C version to handle borders.
        if (work_w != 16 || work_h != 16) {
          aom_scaled_2d_c(src_ptr, src_stride, dst_ptr, dst_stride, kernel,
                          x_q4 & 0xf, 16 * src_w / dst_w, y_q4 & 0xf,
                          16 * src_h / dst_h, work_w, work_h);
        } else {
          aom_scaled_2d(src_ptr, src_stride, dst_ptr, dst_stride, kernel,
                        x_q4 & 0xf, 16 * src_w / dst_w, y_q4 & 0xf,
                        16 * src_h / dst_h, 16, 16);
        }
      }
    }
  }
  aom_extend_frame_borders(dst, num_planes);
}